

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btIDebugDraw.h
# Opt level: O0

void __thiscall
btIDebugDraw::drawCylinder
          (btIDebugDraw *this,btScalar radius,btScalar halfHeight,int upAxis,btTransform *transform,
          btVector3 *color)

{
  btScalar bVar1;
  btVector3 *pbVar2;
  btScalar *pbVar3;
  undefined8 in_RCX;
  btTransform *in_RDX;
  int in_ESI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  btScalar in_XMM1_Da;
  btVector3 xaxis;
  btVector3 yaxis;
  int i;
  btVector3 capEnd;
  btVector3 capStart;
  int stepDegrees;
  btVector3 offsetHeight;
  btVector3 start;
  btVector3 *in_stack_fffffffffffffe28;
  btMatrix3x3 *in_stack_fffffffffffffe30;
  btMatrix3x3 *m;
  btScalar local_18c [4];
  btScalar local_17c [4];
  btScalar local_16c [4];
  btScalar local_15c [4];
  btScalar local_14c [4];
  btScalar local_13c [4];
  btScalar local_12c [4];
  btScalar local_11c [4];
  btScalar local_10c;
  btScalar local_108;
  btScalar local_104;
  undefined1 local_100 [60];
  btScalar local_c4 [4];
  btScalar local_b4 [4];
  btScalar local_a4 [4];
  int local_94;
  btScalar local_90;
  btScalar local_8c;
  btScalar local_88;
  btVector3 local_84;
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c;
  btVector3 local_68;
  int local_58;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btVector3 local_48;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  btTransform *local_20;
  int local_14;
  btScalar local_10;
  float local_c;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  pbVar2 = btTransform::getOrigin(in_RDX);
  local_38 = *(undefined8 *)pbVar2->m_floats;
  local_30 = *(undefined8 *)(pbVar2->m_floats + 2);
  local_4c = 0.0;
  local_50 = 0.0;
  local_54 = 0.0;
  btVector3::btVector3(&local_48,&local_4c,&local_50,&local_54);
  bVar1 = local_10;
  pbVar3 = btVector3::operator_cast_to_float_(&local_48);
  pbVar3[local_14] = bVar1;
  local_58 = 0x1e;
  local_6c = 0.0;
  local_70 = 0.0;
  local_74 = 0.0;
  btVector3::btVector3(&local_68,&local_6c,&local_70,&local_74);
  bVar1 = -local_10;
  pbVar3 = btVector3::operator_cast_to_float_(&local_68);
  pbVar3[local_14] = bVar1;
  local_88 = 0.0;
  local_8c = 0.0;
  local_90 = 0.0;
  btVector3::btVector3(&local_84,&local_88,&local_8c,&local_90);
  pbVar3 = btVector3::operator_cast_to_float_(&local_84);
  pbVar3[local_14] = local_10;
  for (local_94 = 0; local_94 < 0x168; local_94 = local_58 + local_94) {
    bVar1 = btSin(0.0);
    fVar4 = bVar1 * local_c;
    pbVar3 = btVector3::operator_cast_to_float_(&local_68);
    pbVar3[local_14 + 1 + ((local_14 + 1) / 3) * -3] = fVar4;
    pbVar3 = btVector3::operator_cast_to_float_(&local_84);
    pbVar3[local_14 + 1 + ((local_14 + 1) / 3) * -3] = fVar4;
    bVar1 = btCos(0.0);
    fVar4 = bVar1 * local_c;
    pbVar3 = btVector3::operator_cast_to_float_(&local_68);
    pbVar3[local_14 + 2 + ((local_14 + 2) / 3) * -3] = fVar4;
    pbVar3 = btVector3::operator_cast_to_float_(&local_84);
    pbVar3[local_14 + 2 + ((local_14 + 2) / 3) * -3] = fVar4;
    btTransform::getBasis(local_20);
    local_b4 = (btScalar  [4])::operator*(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_a4 = (btScalar  [4])operator+(in_stack_fffffffffffffe30->m_el,in_stack_fffffffffffffe28);
    btTransform::getBasis(local_20);
    local_100._44_16_ =
         (undefined1  [16])::operator*(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_c4 = (btScalar  [4])operator+(in_stack_fffffffffffffe30->m_el,in_stack_fffffffffffffe28);
    (**(code **)(*in_RDI + 0x20))(in_RDI,local_a4,local_c4,local_28);
  }
  local_100._24_4_ = 0.0;
  local_100._20_4_ = 0.0;
  local_100._16_4_ = 0.0;
  pbVar2 = (btVector3 *)(local_100 + 0x1c);
  btVector3::btVector3
            (pbVar2,(btScalar *)(local_100 + 0x18),(btScalar *)(local_100 + 0x14),
             (btScalar *)(local_100 + 0x10));
  pbVar3 = btVector3::operator_cast_to_float_(pbVar2);
  pbVar3[local_14] = 1.0;
  local_104 = 0.0;
  local_108 = 0.0;
  local_10c = 0.0;
  m = (btMatrix3x3 *)local_100;
  btVector3::btVector3((btVector3 *)m,&local_104,&local_108,&local_10c);
  pbVar3 = btVector3::operator_cast_to_float_(m->m_el);
  pbVar3[local_14 + 1 + ((local_14 + 1) / 3) * -3] = 1.0;
  btTransform::getBasis(local_20);
  local_12c = (btScalar  [4])::operator*(m,pbVar2);
  local_11c = (btScalar  [4])operator-(m->m_el,pbVar2);
  btTransform::getBasis(local_20);
  local_13c = (btScalar  [4])::operator*(m,pbVar2);
  btTransform::getBasis(local_20);
  local_14c = (btScalar  [4])::operator*(m,pbVar2);
  (**(code **)(*in_RDI + 0x88))(in_RDI,local_11c,local_13c,local_14c,local_28,0);
  btTransform::getBasis(local_20);
  local_16c = (btScalar  [4])::operator*(m,pbVar2);
  local_15c = (btScalar  [4])operator+(m->m_el,pbVar2);
  btTransform::getBasis(local_20);
  local_17c = (btScalar  [4])::operator*(m,pbVar2);
  btTransform::getBasis(local_20);
  local_18c = (btScalar  [4])::operator*(m,pbVar2);
  (**(code **)(*in_RDI + 0x88))(in_RDI,local_15c,local_17c,local_18c,local_28,0);
  return;
}

Assistant:

virtual void drawCylinder(btScalar radius, btScalar halfHeight, int upAxis, const btTransform& transform, const btVector3& color)
	{
		btVector3 start = transform.getOrigin();
		btVector3	offsetHeight(0,0,0);
		offsetHeight[upAxis] = halfHeight;
		int stepDegrees=30;
		btVector3 capStart(0.f,0.f,0.f);
		capStart[upAxis] = -halfHeight;
		btVector3 capEnd(0.f,0.f,0.f);
		capEnd[upAxis] = halfHeight;

		for (int i=0;i<360;i+=stepDegrees)
		{
			capEnd[(upAxis+1)%3] = capStart[(upAxis+1)%3] = btSin(btScalar(i)*SIMD_RADS_PER_DEG)*radius;
			capEnd[(upAxis+2)%3] = capStart[(upAxis+2)%3]  = btCos(btScalar(i)*SIMD_RADS_PER_DEG)*radius;
			drawLine(start+transform.getBasis() * capStart,start+transform.getBasis() * capEnd, color);
		}
		// Drawing top and bottom caps of the cylinder
		btVector3 yaxis(0,0,0);
		yaxis[upAxis] = btScalar(1.0);
		btVector3 xaxis(0,0,0);
		xaxis[(upAxis+1)%3] = btScalar(1.0);
		drawArc(start-transform.getBasis()*(offsetHeight),transform.getBasis()*yaxis,transform.getBasis()*xaxis,radius,radius,0,SIMD_2_PI,color,false,btScalar(10.0));
		drawArc(start+transform.getBasis()*(offsetHeight),transform.getBasis()*yaxis,transform.getBasis()*xaxis,radius,radius,0,SIMD_2_PI,color,false,btScalar(10.0));
	}